

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelperDefinitions.cpp
# Opt level: O0

double __thiscall helper::log(helper *this,double __x)

{
  LogLevel in_ESI;
  double dVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  LogLevel local_14;
  helper *phStack_10;
  LogLevel level_local;
  String8 *text_local;
  
  local_14 = in_ESI;
  phStack_10 = this;
  std::operator+(&local_38,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this
                 ,'\n');
  logMultiline(&local_38,local_14);
  dVar1 = (double)std::__cxx11::string::~string((string *)&local_38);
  return dVar1;
}

Assistant:

inline void log( const String8 &text, LogLevel level )
	{
		logMultiline( text + '\n', level );
	}